

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

void __thiscall chrono::collision::ChConvexDecompositionHACD::Reset(ChConvexDecompositionHACD *this)

{
  pointer pVVar1;
  pointer pVVar2;
  HACD *pHVar3;
  
  if (this->myHACD != (HACD *)0x0) {
    HACD::DestroyHACD(this->myHACD);
  }
  this->myHACD = (HACD *)0x0;
  pHVar3 = HACD::CreateHACD((HeapManager *)0x0);
  this->myHACD = pHVar3;
  pVVar1 = (this->points).
           super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->points).super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->points).super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->triangles).
           super__Vector_base<HACD::Vec3<long>,_std::allocator<HACD::Vec3<long>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->triangles).super__Vector_base<HACD::Vec3<long>,_std::allocator<HACD::Vec3<long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->triangles).super__Vector_base<HACD::Vec3<long>,_std::allocator<HACD::Vec3<long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  return;
}

Assistant:

void ChConvexDecompositionHACD::Reset(void) {
    if (myHACD)
        HACD::DestroyHACD(myHACD);
    myHACD = 0;
    myHACD = HACD::CreateHACD();
    this->points.clear();
    this->triangles.clear();
}